

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void numusehash(Table *t,Counters *ct)

{
  Node *pNVar1;
  uint uVar2;
  Node *n;
  uint total;
  uint i;
  Counters *ct_local;
  Table *t_local;
  
  n._0_4_ = 0;
  n._4_4_ = 1 << (t->lsizenode & 0x1f);
  while (uVar2 = n._4_4_ - 1, n._4_4_ != 0) {
    pNVar1 = t->node;
    n._4_4_ = uVar2;
    if (((&pNVar1->u)[uVar2].tt_ & 0xf) == 0) {
      ct->deleted = 1;
    }
    else {
      n._0_4_ = (int)n + 1;
      if ((&pNVar1->u)[uVar2].key_tt == '\x03') {
        countint((&pNVar1->u)[uVar2].key_val.i,ct);
      }
    }
  }
  ct->total = (int)n + ct->total;
  return;
}

Assistant:

static void numusehash (const Table *t, Counters *ct) {
  unsigned i = sizenode(t);
  unsigned total = 0;
  while (i--) {
    Node *n = &t->node[i];
    if (isempty(gval(n))) {
      lua_assert(!keyisnil(n));  /* entry was deleted; key cannot be nil */
      ct->deleted = 1;
    }
    else {
      total++;
      if (keyisinteger(n))
        countint(keyival(n), ct);
    }
  }
  ct->total += total;
}